

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLEntityDecl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLEntityDecl::XMLEntityDecl
          (XMLEntityDecl *this,XMLCh *entName,XMLCh value,MemoryManager *manager)

{
  XMLCh *pXVar1;
  OutOfMemoryException *anon_var_0;
  code *pcStack_60;
  XMLCh dummy [2];
  undefined1 local_50 [8];
  CleanupType_conflict10 cleanup;
  MemoryManager *manager_local;
  XMLCh value_local;
  XMLCh *entName_local;
  XMLEntityDecl *this_local;
  
  XSerializable::XSerializable(&this->super_XSerializable);
  XMemory::XMemory((XMemory *)this);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLEntityDecl_0052eea8;
  this->fId = 0;
  this->fValueLen = 1;
  this->fValue = (XMLCh *)0x0;
  this->fName = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fIsExternal = false;
  this->fMemoryManager = manager;
  pcStack_60 = cleanUp;
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLEntityDecl> *)local_50,this,(MFPT)cleanUp);
  anon_var_0._4_4_ = (uint)(ushort)value;
  pXVar1 = XMLString::replicate((XMLCh *)((long)&anon_var_0 + 4),this->fMemoryManager);
  this->fValue = pXVar1;
  pXVar1 = XMLString::replicate(entName,this->fMemoryManager);
  this->fName = pXVar1;
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLEntityDecl> *)local_50);
  JanitorMemFunCall<xercesc_4_0::XMLEntityDecl>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLEntityDecl> *)local_50);
  return;
}

Assistant:

XMLEntityDecl::XMLEntityDecl(const  XMLCh* const   entName
                            , const XMLCh          value
                            , MemoryManager* const manager) :
    fId(0)
    , fValueLen(1)
    , fValue(0)
    , fName(0)
    , fNotationName(0)
    , fPublicId(0)
    , fSystemId(0)
    , fBaseURI(0)
    , fIsExternal(false)
    , fMemoryManager(manager)
{
    CleanupType cleanup(this, &XMLEntityDecl::cleanUp);

    try
    {
        XMLCh dummy[2] = { chNull, chNull };
        dummy[0] = value;
        fValue = XMLString::replicate(dummy, fMemoryManager);
        fName = XMLString::replicate(entName, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}